

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vextractd_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t index)

{
  uint32_t s;
  uint32_t es;
  uint32_t index_local;
  ppc_avr_t *b_local;
  ppc_avr_t *r_local;
  
  memmove(r->u8 + 8,(void *)((long)b + (ulong)(8 - index)),8);
  memset(r,0,8);
  memset(r + 1,0,0);
  return;
}

Assistant:

void helper_xxextractuw(CPUPPCState *env, ppc_vsr_t *xt,
                        ppc_vsr_t *xb, uint32_t index)
{
    ppc_vsr_t t = { 0 };
    size_t es = sizeof(uint32_t);
    uint32_t ext_index;
    int i;

    ext_index = index;
    for (i = 0; i < es; i++, ext_index++) {
        t.VsrB(8 - es + i) = xb->VsrB(ext_index % 16);
    }

    *xt = t;
}